

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendReceiver.cpp
# Opt level: O0

void __thiscall SendReceiver::printRequestData(SendReceiver *this)

{
  ostream *poVar1;
  element_type *peVar2;
  element_type *peVar3;
  SendReceiver *this_local;
  
  if (((this->super_JHandler).status & 1U) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar1 = std::operator<<(poVar1,(string *)&(this->super_JHandler).error_msg);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Full url to file: ");
    peVar2 = std::__shared_ptr_access<JHandler::url,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<JHandler::url,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    poVar1 = std::operator<<(poVar1,(string *)peVar2);
    poVar1 = std::operator<<(poVar1,"\nShort url to file: ");
    peVar2 = std::__shared_ptr_access<JHandler::url,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<JHandler::url,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    poVar1 = std::operator<<(poVar1,(string *)&peVar2->str_short);
    poVar1 = std::operator<<(poVar1,"\nFile id: ");
    peVar3 = std::__shared_ptr_access<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_JHandler).MD_ptr);
    poVar1 = std::operator<<(poVar1,(string *)peVar3);
    poVar1 = std::operator<<(poVar1,"\nFilename: ");
    peVar3 = std::__shared_ptr_access<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_JHandler).MD_ptr);
    poVar1 = std::operator<<(poVar1,(string *)&peVar3->name);
    poVar1 = std::operator<<(poVar1,"\nSize of file: ");
    peVar3 = std::__shared_ptr_access<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_JHandler).MD_ptr);
    poVar1 = std::operator<<(poVar1,(string *)&peVar3->size);
    std::operator<<(poVar1,'\n');
  }
  return;
}

Assistant:

void SendReceiver::printRequestData() {
  if (status) {
    std::cout << "Full url to file: " << url_ptr->str_full
              << "\nShort url to file: " << url_ptr->str_short
              << "\nFile id: " << MD_ptr->id
              << "\nFilename: " << MD_ptr->name
              << "\nSize of file: " << MD_ptr->size << '\n';
  } else
    std::cerr << "Error: " << error_msg << std::endl;
}